

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<long_long> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<long_long> PVar1;
  _Vector_base<long_long,_std::allocator<long_long>_> _Stack_28;
  
  ValueArray<long_long,long_long,long_long,long_long,long_long,long_long,long_long>::
  MakeVector<long_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul>(&_Stack_28);
  ValuesIn<std::vector<long_long,std::allocator<long_long>>>
            ((testing *)this,(vector<long_long,_std::allocator<long_long>_> *)&_Stack_28);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<long_long>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<long_long>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }